

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O2

Optional<unsigned_int> __thiscall Catch::parseUInt(Catch *this,string *input,int base)

{
  unsigned_long_long uVar1;
  Catch *pCVar2;
  undefined8 extraout_RDX;
  Optional<unsigned_int> OVar3;
  size_t pos;
  string trimmed;
  size_t local_40;
  string local_38;
  
  trim(&local_38,input);
  if ((local_38._M_string_length == 0) || (*local_38._M_dataplus._M_p == '-')) {
    *(undefined8 *)this = 0;
  }
  else {
    local_40 = 0;
    uVar1 = std::__cxx11::stoull(&local_38,&local_40,base);
    if (uVar1 >> 0x20 == 0 && local_40 == local_38._M_string_length) {
      pCVar2 = this + 8;
      *(int *)(this + 8) = (int)uVar1;
    }
    else {
      pCVar2 = (Catch *)0x0;
    }
    *(Catch **)this = pCVar2;
  }
  std::__cxx11::string::~string((string *)&local_38);
  OVar3.storage[0] = (char)extraout_RDX;
  OVar3.storage[1] = (char)((ulong)extraout_RDX >> 8);
  OVar3.storage[2] = (char)((ulong)extraout_RDX >> 0x10);
  OVar3.storage[3] = (char)((ulong)extraout_RDX >> 0x18);
  OVar3._12_4_ = (int)((ulong)extraout_RDX >> 0x20);
  OVar3.nullableValue = (uint *)this;
  return OVar3;
}

Assistant:

Optional<unsigned int> parseUInt(std::string const& input, int base) {
        auto trimmed = trim( input );
        // std::stoull is annoying and accepts numbers starting with '-',
        // it just negates them into unsigned int
        if ( trimmed.empty() || trimmed[0] == '-' ) {
            return {};
        }

        CATCH_TRY {
            size_t pos = 0;
            const auto ret = std::stoull( trimmed, &pos, base );

            // We did not consume the whole input, so there is an issue
            // This can be bunch of different stuff, like multiple numbers
            // in the input, or invalid digits/characters and so on. Either
            // way, we do not want to return the partially parsed result.
            if ( pos != trimmed.size() ) {
                return {};
            }
            // Too large
            if ( ret > std::numeric_limits<unsigned int>::max() ) {
                return {};
            }
            return static_cast<unsigned int>(ret);
        }